

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O1

void __thiscall GB::call_nn(GB *this)

{
  u8 uVar1;
  u16 uVar2;
  ulong uVar3;
  
  uVar3 = (this->s).op_tick - 0xe;
  switch(uVar3 << 0x3d | uVar3 >> 3) {
  case 0:
    uVar2 = (this->s).pc;
    (this->s).pc = uVar2 + 1;
    uVar1 = Read(this,uVar2);
    (this->s).field_6.field_0.z = uVar1;
    break;
  case 1:
    uVar2 = (this->s).pc;
    (this->s).pc = uVar2 + 1;
    uVar1 = Read(this,uVar2);
    (this->s).field_6.field_0.w = uVar1;
    break;
  case 3:
    uVar1 = *(u8 *)((long)&(this->s).pc + 1);
    uVar2 = (this->s).sp - 1;
    (this->s).sp = uVar2;
    Write(this,uVar2,uVar1);
    return;
  case 4:
    uVar2 = (this->s).sp - 1;
    (this->s).sp = uVar2;
    Write(this,uVar2,(u8)(this->s).pc);
    (this->s).pc = (u16)(this->s).field_6;
    (this->s).op_tick = -2;
  }
  return;
}

Assistant:

void GB::call_nn() {
  switch (s.op_tick) {
    case 14: s.z = read_n(); break;
    case 22: s.w = read_n(); break;
    case 38: push(s.pc >> 8); break;
    case 46: push(s.pc); s.pc = s.wz; op_done(); break;
  }
}